

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O0

MPP_RET __thiscall Mpp::put_frame_async(Mpp *this,MppFrame frame)

{
  int iVar1;
  MPP_RET MVar2;
  MppFrame local_20;
  MppFrame frame_local;
  Mpp *this_local;
  
  if (this->mFrmIn == (mpp_list *)0x0) {
    this_local._4_4_ = MPP_NOK;
  }
  else {
    local_20 = frame;
    frame_local = this;
    iVar1 = MppMutexCond::trylock(&this->mFrmIn->super_MppMutexCond);
    if (iVar1 == 0) {
      MVar2 = mpp_list::wait_le(this->mFrmIn,10,1);
      if (MVar2 == MPP_OK) {
        mpp_list::add_at_tail(this->mFrmIn,&local_20,8);
        this->mFramePutCount = this->mFramePutCount + 1;
        notify(this,1);
        MppMutexCond::unlock(&this->mFrmIn->super_MppMutexCond);
        this_local._4_4_ = MPP_OK;
      }
      else {
        MppMutexCond::unlock(&this->mFrmIn->super_MppMutexCond);
        this_local._4_4_ = MPP_NOK;
      }
    }
    else {
      this_local._4_4_ = MPP_NOK;
    }
  }
  return this_local._4_4_;
}

Assistant:

MPP_RET Mpp::put_frame_async(MppFrame frame)
{
    if (NULL == mFrmIn)
        return MPP_NOK;

    if (mFrmIn->trylock())
        return MPP_NOK;

    /* NOTE: the max input queue length is 2 */
    if (mFrmIn->wait_le(10, 1)) {
        mFrmIn->unlock();
        return MPP_NOK;
    }

    mFrmIn->add_at_tail(&frame, sizeof(frame));
    mFramePutCount++;

    notify(MPP_INPUT_ENQUEUE);
    mFrmIn->unlock();

    return MPP_OK;
}